

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O3

Element __thiscall wasm::RandomLattice::makeElement(RandomLattice *this)

{
  RandomLattice *this_00;
  bool bVar1;
  uint32_t uVar2;
  LatticeImpl *pLVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *extraout_RDX_09;
  _Head_base<0UL,_void_*,_false> _Var4;
  undefined8 *in_RSI;
  int iVar5;
  Random *pRVar6;
  type *l;
  long lVar7;
  Element EVar8;
  RandomLattice local_98;
  RandomLattice local_88;
  undefined1 auStack_78 [8];
  vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
  elem;
  _Variadic_union<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
  local_58;
  undefined1 local_38;
  
  this_00 = (RandomLattice *)in_RSI[1];
  if (this_00 == (RandomLattice *)0x0) {
switchD_0019754a_default:
    wasm::handle_unreachable
              ("unexpected lattice",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp"
               ,0x17f);
  }
  switch(*(undefined1 *)
          &this_00[2].lattice._M_t.
           super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
           .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl) {
  case 0:
    RandomFullLattice::makeElement((RandomFullLattice *)auStack_78);
    local_58._M_rest._0_8_ =
         (undefined8)(_Uninitialized<wasm::analysis::Flat<unsigned_int>::Element,_true>)auStack_78;
    local_58._8_8_ =
         elem.
         super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38 = 0;
    pLVar3 = (LatticeImpl *)operator_new(0x28);
    std::__detail::__variant::
    _Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::_Move_ctor_base((_Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                       *)pLVar3,
                      (_Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                       *)&local_58._M_first);
    this->rand = (Random *)
                 RandomElement<wasm::RandomLattice>::RandomElement::anon_class_1_0_00000001::
                 __invoke;
    (this->lattice)._M_t.
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl = pLVar3;
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                         *)&local_58._M_first);
    _Var4._M_head_impl = extraout_RDX;
    if (elem.
        super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)auStack_78)();
      _Var4._M_head_impl = extraout_RDX_00;
    }
    break;
  case 1:
    uVar2 = Random::upTo((Random *)*in_RSI,6);
    if (uVar2 == 5) {
      local_58._M_rest._0_8_ = (undefined8)(Element)0x200000000;
      local_38 = 1;
      pLVar3 = (LatticeImpl *)operator_new(0x28);
    }
    else if (uVar2 == 4) {
      local_58._M_rest._0_8_ = (undefined8)(Element)0x0;
      local_38 = 1;
      pLVar3 = (LatticeImpl *)operator_new(0x28);
    }
    else {
      local_58._M_rest._0_8_ = (undefined8)((ulong)uVar2 | 0x100000000);
      local_38 = 1;
      pLVar3 = (LatticeImpl *)operator_new(0x28);
    }
    std::__detail::__variant::
    _Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::_Move_ctor_base((_Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                       *)pLVar3,
                      (_Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                       *)&local_58._M_first);
    this->rand = (Random *)
                 RandomElement<wasm::RandomLattice>::RandomElement::anon_class_1_0_00000001::
                 __invoke;
    (this->lattice)._M_t.
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl = pLVar3;
    goto LAB_0019791e;
  case 2:
    uVar2 = Random::upTo((Random *)*in_RSI,4);
    if (uVar2 == 0) {
      local_58._16_8_ = local_58._16_8_ & 0xffffffffffffff00;
    }
    else {
      makeElement((RandomLattice *)auStack_78);
      local_58._8_8_ =
           elem.
           super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      elem.
      super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58._M_rest._0_8_ =
           (undefined8)(_Uninitialized<wasm::analysis::Flat<unsigned_int>::Element,_true>)auStack_78
      ;
      local_58._16_1_ = 1;
    }
    local_38 = 2;
    pLVar3 = (LatticeImpl *)operator_new(0x28);
    std::__detail::__variant::
    _Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::_Move_ctor_base((_Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                       *)pLVar3,
                      (_Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                       *)&local_58._M_first);
    this->rand = (Random *)
                 RandomElement<wasm::RandomLattice>::RandomElement::anon_class_1_0_00000001::
                 __invoke;
    (this->lattice)._M_t.
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl = pLVar3;
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                         *)&local_58._M_first);
    _Var4._M_head_impl = extraout_RDX_07;
    if ((uVar2 != 0) &&
       (elem.
        super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
      (*(code *)auStack_78)();
      _Var4._M_head_impl = extraout_RDX_08;
    }
    break;
  case 3:
    makeElement((RandomLattice *)auStack_78);
    makeElement((RandomLattice *)
                &elem.
                 super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    local_58._M_rest._0_8_ =
         (undefined8)(_Uninitialized<wasm::analysis::Flat<unsigned_int>::Element,_true>)auStack_78;
    local_58._8_8_ =
         elem.
         super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58._16_8_ =
         elem.
         super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_58._24_8_ =
         elem.
         super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38 = 3;
    pLVar3 = (LatticeImpl *)operator_new(0x28);
    std::__detail::__variant::
    _Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::_Move_ctor_base((_Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                       *)pLVar3,
                      (_Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                       *)&local_58._M_first);
    this->rand = (Random *)
                 RandomElement<wasm::RandomLattice>::RandomElement::anon_class_1_0_00000001::
                 __invoke;
    (this->lattice)._M_t.
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl = pLVar3;
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                         *)&local_58._M_first);
    lVar7 = 0x20;
    _Var4._M_head_impl = extraout_RDX_02;
    do {
      if (*(long *)(auStack_78 + lVar7 + -8) != 0) {
        (**(code **)((long)&local_88.rand + lVar7))();
        _Var4._M_head_impl = extraout_RDX_03;
      }
      *(undefined8 *)(auStack_78 + lVar7 + -8) = 0;
      lVar7 = lVar7 + -0x10;
    } while (lVar7 != 0);
    break;
  case 4:
    auStack_78._0_4_ =
         (_Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
          )0x0;
    auStack_78[4] = '\0';
    auStack_78._5_3_ = 0;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ::reserve((vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
               *)auStack_78,(size_type)this_00[1].rand);
    if (this_00[1].rand != (Random *)0x0) {
      pRVar6 = (Random *)0x0;
      do {
        makeElement((RandomLattice *)&local_58._M_first);
        std::
        vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>
        ::emplace_back<wasm::RandomElement<wasm::RandomLattice>>
                  ((vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>
                    *)auStack_78,(RandomElement<wasm::RandomLattice> *)&local_58._M_first);
        if ((pointer)local_58._8_8_ != (pointer)0x0) {
          (*(code *)local_58._M_rest._0_8_)();
        }
        pRVar6 = (Random *)
                 ((long)&(pRVar6->bytes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start + 1);
      } while (pRVar6 < this_00[1].rand);
    }
    local_58._M_rest._0_8_ =
         (undefined8)(_Uninitialized<wasm::analysis::Flat<unsigned_int>::Element,_true>)auStack_78;
    local_58._8_8_ =
         elem.
         super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_58._16_8_ =
         elem.
         super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_78 = (undefined1  [8])0x0;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38 = 4;
    pLVar3 = (LatticeImpl *)operator_new(0x28);
    std::__detail::__variant::
    _Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::_Move_ctor_base((_Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                       *)pLVar3,
                      (_Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                       *)&local_58._M_first);
    this->rand = (Random *)
                 RandomElement<wasm::RandomLattice>::RandomElement::anon_class_1_0_00000001::
                 __invoke;
    (this->lattice)._M_t.
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl = pLVar3;
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                         *)&local_58._M_first);
    std::
    vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ::~vector((vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
               *)auStack_78);
    _Var4._M_head_impl = extraout_RDX_01;
    break;
  case 5:
    makeElement(&local_98);
    makeElement(&local_88);
    local_58._8_8_ = local_88.lattice;
    local_58._24_8_ = local_98.lattice;
    auStack_78 = (undefined1  [8])local_88.rand;
    local_88.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
            )0x0;
    local_58._M_rest._0_8_ =
         (undefined8)
         (_Uninitialized<wasm::analysis::Flat<unsigned_int>::Element,_true>)local_88.rand;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_98.rand;
    local_98.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
            )0x0;
    local_58._16_8_ = local_98.rand;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38 = 5;
    RandomElement<wasm::RandomLattice>::RandomElement
              ((RandomElement<wasm::RandomLattice> *)this,(ElementImpl *)&local_58._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                         *)&local_58._M_first);
    std::
    _Tuple_impl<0UL,_wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>
    ::~_Tuple_impl((_Tuple_impl<0UL,_wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>
                    *)auStack_78);
    _Var4._M_head_impl = extraout_RDX_04;
    if (local_88.lattice._M_t.
        super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
        .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
         )0x0) {
      (*(code *)local_88.rand)();
      _Var4._M_head_impl = extraout_RDX_05;
    }
    if (local_98.lattice._M_t.
        super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
        .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
         )0x0) {
      (*(code *)local_98.rand)();
      _Var4._M_head_impl = extraout_RDX_06;
    }
    break;
  case 6:
    makeElement((RandomLattice *)&local_58._M_first);
    bVar1 = join(this_00,(Element *)(this_00 + 1),(Element *)&local_58._M_first);
    iVar5 = 0;
    if (bVar1) {
      iVar5 = *(int *)&this_00[2].rand + 1;
      *(int *)&this_00[2].rand = iVar5;
    }
    if ((pointer)local_58._8_8_ != (pointer)0x0) {
      (*(code *)local_58._M_rest._0_8_)();
    }
    local_58._8_4_ = iVar5;
    local_38 = 6;
    local_58._M_rest._0_8_ = (undefined8)(this_00 + 1);
    RandomElement<wasm::RandomLattice>::RandomElement
              ((RandomElement<wasm::RandomLattice> *)this,(ElementImpl *)&local_58._M_first);
LAB_0019791e:
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                         *)&local_58._M_first);
    _Var4._M_head_impl = extraout_RDX_09;
    break;
  default:
    goto switchD_0019754a_default;
  }
  EVar8.super_unique_ptr<void,_void_(*)(void_*)>._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>.
  _M_t.super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
  _M_head_impl = _Var4._M_head_impl;
  EVar8.super_unique_ptr<void,_void_(*)(void_*)>._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>.
  _M_t.super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)(_Head_base<1UL,_void_(*)(void_*),_false>)this;
  return (Element)EVar8.super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                  super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>;
}

Assistant:

RandomLattice::Element RandomLattice::makeElement() const noexcept {
  if (const auto* l = std::get_if<RandomFullLattice>(lattice.get())) {
    return ElementImpl{l->makeElement()};
  }
  if (const auto* l = std::get_if<Flat<uint32_t>>(lattice.get())) {
    auto pick = rand.upTo(6);
    switch (pick) {
      case 4:
        return ElementImpl{l->getBottom()};
      case 5:
        return ElementImpl{l->getTop()};
      default:
        return ElementImpl{l->get(std::move(pick))};
    }
  }
  if (const auto* l = std::get_if<Lift<RandomLattice>>(lattice.get())) {
    return ElementImpl{rand.oneIn(4) ? l->getBottom()
                                     : l->get(l->lattice.makeElement())};
  }
  if (const auto* l = std::get_if<ArrayLattice>(lattice.get())) {
    return ElementImpl{typename ArrayLattice::Element{
      l->lattice.makeElement(), l->lattice.makeElement()}};
  }
  if (const auto* l = std::get_if<Vector<RandomLattice>>(lattice.get())) {
    std::vector<typename RandomLattice::Element> elem;
    elem.reserve(l->size);
    for (size_t i = 0; i < l->size; ++i) {
      elem.push_back(l->lattice.makeElement());
    }
    return ElementImpl{std::move(elem)};
  }
  if (const auto* l = std::get_if<TupleLattice>(lattice.get())) {
    return ElementImpl{
      typename TupleLattice::Element{std::get<0>(l->lattices).makeElement(),
                                     std::get<1>(l->lattices).makeElement()}};
  }
  if (const auto* l = std::get_if<SharedPath<RandomLattice>>(lattice.get())) {
    auto elem = l->getBottom();
    l->join(elem, l->lattice.makeElement());
    return ElementImpl{elem};
  }
  WASM_UNREACHABLE("unexpected lattice");
}